

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  ushort uVar1;
  sqlite3 *db;
  long lVar2;
  ulong uVar3;
  void *__src;
  long *plVar4;
  Parse *pPVar5;
  WhereInfo *pWInfo_00;
  Index *pTab_00;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int iCol;
  Index *pPk;
  int iPk;
  Table *pTab;
  int in_stack_00000048;
  int addrCont;
  int jmp;
  int nPk;
  int r;
  int iCur;
  WhereTerm *pTerm;
  Subquery *pSubq;
  SrcItem *pRight;
  int iIdxCur;
  int k;
  Bitmask mAll;
  SrcItem *pTabItem;
  WhereLoop *pLoop;
  WhereInfo *pSubWInfo;
  WhereClause *pWC;
  Expr *pSubWhere;
  WhereRightJoin *pRJ;
  Vdbe *v;
  Parse *pParse;
  SrcList sFrom;
  int in_stack_fffffffffffffec8;
  int p1;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar6;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  sqlite3 *in_stack_fffffffffffffee0;
  Parse *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  Table *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar7;
  int local_bc;
  ulong local_b8;
  Parse *local_90;
  undefined1 auStack_50 [7];
  WhereInfo *in_stack_ffffffffffffffd0;
  ExprList *in_stack_ffffffffffffffd8;
  ExprList *in_stack_ffffffffffffffe0;
  Expr *in_stack_ffffffffffffffe8;
  SrcList *in_stack_fffffffffffffff0;
  Parse *pParse_00;
  
  pParse_00 = *(Parse **)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)*in_RDI;
  local_90 = (Parse *)0x0;
  lVar2 = *(long *)(in_RDX + 0x60);
  __src = (void *)(in_RDI[1] + 8 + (ulong)*(byte *)(in_RDX + 0x40) * 0x48);
  memset(&stack0xffffffffffffffa8,0xaa,0x50);
  local_b8 = 0;
  sqlite3VdbeExplain((Parse *)db,'\x01',"RIGHT-JOIN %s",**(undefined8 **)((long)__src + 0x10));
  for (local_bc = 0; local_bc < in_ESI; local_bc = local_bc + 1) {
    local_b8 = *(ulong *)(in_RDI[(long)local_bc * 0xe + 0x77] + 8) | local_b8;
    if ((*(ushort *)
          (in_RDI[1] + (ulong)*(byte *)(in_RDI + (long)local_bc * 0xe + 0x73) * 0x48 + 0x21) >> 6 &
        1) != 0) {
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffee8,
                        (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                        (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                        in_stack_fffffffffffffed8);
    }
    sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    if (*(int *)(in_RDI + (long)local_bc * 0xe + 0x6c) != 0) {
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    }
  }
  if ((*(byte *)((long)__src + 0x18) & 0x40) == 0) {
    uVar3 = *(ulong *)(lVar2 + 8);
    local_bc = 0;
    while ((local_bc < *(int *)((long)in_RDI + 0x7c) &&
           ((plVar4 = (long *)(in_RDI[0x11] + (long)local_bc * 0x38),
            (*(ushort *)((long)plVar4 + 0x12) & 0x8002) == 0 ||
            (*(short *)((long)plVar4 + 0x14) == 0x2000))))) {
      if (((plVar4[6] & ((uVar3 | local_b8) ^ 0xffffffffffffffff)) == 0) &&
         ((*(uint *)(*plVar4 + 4) & 3) == 0)) {
        in_stack_fffffffffffffee0 = db;
        sqlite3ExprDup(db,(Expr *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       in_stack_fffffffffffffed4);
        pPVar5 = (Parse *)sqlite3ExprAnd(local_90,(Expr *)in_stack_fffffffffffffee0,
                                         (Expr *)CONCAT44(in_stack_fffffffffffffedc,
                                                          in_stack_fffffffffffffed8));
        in_stack_fffffffffffffee8 = local_90;
        local_90 = pPVar5;
      }
      local_bc = local_bc + 1;
    }
  }
  memcpy(auStack_50,__src,0x48);
  *(char *)((long)&db->aDb + 6) = *(char *)((long)&db->aDb + 6) + '\x01';
  p1 = 0x1000;
  uVar6 = 0;
  pWInfo_00 = sqlite3WhereBegin(pParse_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                                in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (Select *)in_stack_ffffffffffffffd0,(u16)pTab,in_stack_00000048);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    *(int *)((long)&db->lastRowid + 4) = *(int *)((long)&db->lastRowid + 4) + 1;
    sqlite3WhereContinueLabel(pWInfo_00);
    if (((*(Table **)((long)__src + 0x10))->tabFlags & 0x80) == 0) {
      sqlite3ExprCodeGetColumnOfTable
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    }
    else {
      pTab_00 = sqlite3PrimaryKeyIndex(*(Table **)((long)__src + 0x10));
      uVar1 = pTab_00->nKeyCol;
      *(uint *)((long)&db->lastRowid + 4) = (uVar1 - 1) + *(int *)((long)&db->lastRowid + 4);
      for (iVar7 = 0; iVar7 < (int)(uint)uVar1; iVar7 = iVar7 + 1) {
        sqlite3ExprCodeGetColumnOfTable
                  ((Vdbe *)CONCAT44(iVar7,in_stack_ffffffffffffff00),(Table *)pTab_00,
                   (int)pTab_00->aiColumn[iVar7],in_stack_fffffffffffffef0,
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      }
    }
    sqlite3VdbeAddOp4Int
              ((Vdbe *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed4);
    sqlite3VdbeAddOp4Int
              ((Vdbe *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed4);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffed4,uVar6),in_stack_fffffffffffffecc)
    ;
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffed4,uVar6),in_stack_fffffffffffffecc,p1
                      ,0);
    sqlite3WhereEnd(in_stack_ffffffffffffffd0);
  }
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffed4,uVar6),
                    (Expr *)CONCAT44(in_stack_fffffffffffffecc,p1));
  sqlite3VdbeExplainPop((Parse *)0x210ded);
  *(char *)((long)&db->aDb + 6) = *(char *)((long)&db->aDb + 6) + -1;
  if (*(Parse **)(in_FS_OFFSET + 0x28) != pParse_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pSTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    SrcItem *pRight;
    assert( pWInfo->a[k].pWLoop->iTab == pWInfo->a[k].iFrom );
    pRight = &pWInfo->pTabList->a[pWInfo->a[k].iFrom];
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    if( pRight->fg.viaCoroutine ){
      Subquery *pSubq;
      assert( pRight->fg.isSubquery && pRight->u4.pSubq!=0 );
      pSubq = pRight->u4.pSubq;
      assert( pSubq->pSelect!=0 && pSubq->pSelect->pEList!=0 );
      sqlite3VdbeAddOp3(
          v, OP_Null, 0, pSubq->regResult,
          pSubq->regResult + pSubq->pSelect->pEList->nExpr-1
      );
    }
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pSTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}